

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O3

bool __thiscall
basist::basisu_transcoder::start_transcoding(basisu_transcoder *this,void *pData,uint32_t data_size)

{
  uint uVar1;
  uint uVar2;
  basisu_lowlevel_etc1s_transcoder *pbVar3;
  bool bVar4;
  uint uVar5;
  uint32_t uVar6;
  uint selectors_data_size;
  
  bVar4 = validate_header_quick(this,pData,data_size);
  if (!bVar4) {
    return false;
  }
  uVar6 = (this->m_lowlevel_etc1s_decoder).m_local_endpoints.m_size;
  if (*(char *)((long)pData + 0x14) == '\0') {
    if (uVar6 != 0) {
      basisu_lowlevel_etc1s_transcoder::clear(&this->m_lowlevel_etc1s_decoder);
    }
    if ((*(byte *)((long)pData + 0x15) & 8) == 0) {
      uVar5 = (uint)*(uint3 *)((long)pData + 0x2d);
      if (uVar5 == 0) {
        return false;
      }
      selectors_data_size = (uint)*(uint3 *)((long)pData + 0x36);
      if (selectors_data_size == 0) {
        return false;
      }
      if (*(uint *)((long)pData + 0x3d) == 0) {
        return false;
      }
      uVar1 = *(uint *)((long)pData + 0x29);
      if (data_size < uVar1) {
        return false;
      }
      uVar2 = *(uint *)((long)pData + 0x32);
      if (data_size < uVar2) {
        return false;
      }
      if (data_size - *(uint *)((long)pData + 0x39) < *(uint *)((long)pData + 0x3d)) {
        return false;
      }
      if (data_size - uVar2 < selectors_data_size) {
        return false;
      }
      if (data_size - uVar1 < uVar5) {
        return false;
      }
      if (data_size < *(uint *)((long)pData + 0x39)) {
        return false;
      }
      bVar4 = basisu_lowlevel_etc1s_transcoder::decode_palettes
                        (&this->m_lowlevel_etc1s_decoder,(uint)*(ushort *)((long)pData + 0x27),
                         (uint8_t *)((ulong)uVar1 + (long)pData),uVar5,
                         (uint)*(ushort *)((long)pData + 0x30),
                         (uint8_t *)((ulong)uVar2 + (long)pData),selectors_data_size);
      if (!bVar4) {
        return false;
      }
      uVar5 = *(uint *)((long)pData + 0x39);
      uVar6 = *(uint32_t *)((long)pData + 0x3d);
    }
    else {
      pbVar3 = (this->m_lowlevel_etc1s_decoder).m_pGlobal_codebook;
      if (pbVar3 == (basisu_lowlevel_etc1s_transcoder *)0x0) {
        return false;
      }
      uVar5 = (pbVar3->m_local_endpoints).m_size;
      if (uVar5 == 0) {
        return false;
      }
      if (uVar5 != *(ushort *)((long)pData + 0x27)) {
        return false;
      }
      if ((pbVar3->m_local_selectors).m_size != (uint)*(ushort *)((long)pData + 0x30)) {
        return false;
      }
      uVar6 = *(uint *)((long)pData + 0x3d);
      if (uVar6 == 0) {
        return false;
      }
      uVar5 = *(uint *)((long)pData + 0x39);
      if (data_size - uVar5 < uVar6 || data_size < uVar5) {
        return false;
      }
    }
    bVar4 = basisu_lowlevel_etc1s_transcoder::decode_tables
                      (&this->m_lowlevel_etc1s_decoder,(uint8_t *)((long)pData + (ulong)uVar5),uVar6
                      );
    if (!bVar4) {
      return false;
    }
  }
  else if (uVar6 != 0) {
    basisu_lowlevel_etc1s_transcoder::clear(&this->m_lowlevel_etc1s_decoder);
  }
  this->m_ready_to_transcode = true;
  return true;
}

Assistant:

bool basisu_transcoder::start_transcoding(const void* pData, uint32_t data_size)
	{
		if (!validate_header_quick(pData, data_size))
		{
			BASISU_DEVEL_ERROR("basisu_transcoder::start_transcoding: header validation failed\n");
			return false;
		}

		const basis_file_header* pHeader = reinterpret_cast<const basis_file_header*>(pData);
		const uint8_t* pDataU8 = static_cast<const uint8_t*>(pData);

		if (pHeader->m_tex_format == (int)basis_tex_format::cETC1S)
		{
			if (m_lowlevel_etc1s_decoder.m_local_endpoints.size())
			{
				m_lowlevel_etc1s_decoder.clear();
			}

			if (pHeader->m_flags & cBASISHeaderFlagUsesGlobalCodebook)
			{
				if (!m_lowlevel_etc1s_decoder.get_global_codebooks())
				{
					BASISU_DEVEL_ERROR("basisu_transcoder::start_transcoding: File uses global codebooks, but set_global_codebooks() has not been called\n");
					return false;
				}
				if (!m_lowlevel_etc1s_decoder.get_global_codebooks()->get_endpoints().size())
				{
					BASISU_DEVEL_ERROR("basisu_transcoder::start_transcoding: Global codebooks must be unpacked first by calling start_transcoding()\n");
					return false;
				}
				if ((m_lowlevel_etc1s_decoder.get_global_codebooks()->get_endpoints().size() != pHeader->m_total_endpoints) ||
					 (m_lowlevel_etc1s_decoder.get_global_codebooks()->get_selectors().size() != pHeader->m_total_selectors))
				{
					BASISU_DEVEL_ERROR("basisu_transcoder::start_transcoding: Global codebook size mismatch (wrong codebooks for file).\n");
					return false;
				}
				if (!pHeader->m_tables_file_size)
				{
					BASISU_DEVEL_ERROR("basisu_transcoder::start_transcoding: file is corrupted (2)\n");
					return false;
				}
				if (pHeader->m_tables_file_ofs > data_size)
				{
					BASISU_DEVEL_ERROR("basisu_transcoder::start_transcoding: file is corrupted or passed in buffer too small (4)\n");
					return false;
				}
				if (pHeader->m_tables_file_size > (data_size - pHeader->m_tables_file_ofs))
				{
					BASISU_DEVEL_ERROR("basisu_transcoder::start_transcoding: file is corrupted or passed in buffer too small (5)\n");
					return false;
				}
			}
			else
			{
				if (!pHeader->m_endpoint_cb_file_size || !pHeader->m_selector_cb_file_size || !pHeader->m_tables_file_size)
				{
					BASISU_DEVEL_ERROR("basisu_transcoder::start_transcoding: file is corrupted (0)\n");
						return false;
				}

				if ((pHeader->m_endpoint_cb_file_ofs > data_size) || (pHeader->m_selector_cb_file_ofs > data_size) || (pHeader->m_tables_file_ofs > data_size))
				{
					BASISU_DEVEL_ERROR("basisu_transcoder::start_transcoding: file is corrupted or passed in buffer too small (1)\n");
					return false;
				}

				if (pHeader->m_endpoint_cb_file_size > (data_size - pHeader->m_endpoint_cb_file_ofs))
				{
					BASISU_DEVEL_ERROR("basisu_transcoder::start_transcoding: file is corrupted or passed in buffer too small (2)\n");
					return false;
				}

				if (pHeader->m_selector_cb_file_size > (data_size - pHeader->m_selector_cb_file_ofs))
				{
					BASISU_DEVEL_ERROR("basisu_transcoder::start_transcoding: file is corrupted or passed in buffer too small (3)\n");
					return false;
				}

				if (pHeader->m_tables_file_size > (data_size - pHeader->m_tables_file_ofs))
				{
					BASISU_DEVEL_ERROR("basisu_transcoder::start_transcoding: file is corrupted or passed in buffer too small (3)\n");
					return false;
				}

				if (!m_lowlevel_etc1s_decoder.decode_palettes(
					pHeader->m_total_endpoints, pDataU8 + pHeader->m_endpoint_cb_file_ofs, pHeader->m_endpoint_cb_file_size,
					pHeader->m_total_selectors, pDataU8 + pHeader->m_selector_cb_file_ofs, pHeader->m_selector_cb_file_size))
				{
					BASISU_DEVEL_ERROR("basisu_transcoder::start_transcoding: decode_palettes failed\n");
					return false;
				}
			}

			if (!m_lowlevel_etc1s_decoder.decode_tables(pDataU8 + pHeader->m_tables_file_ofs, pHeader->m_tables_file_size))
			{
				BASISU_DEVEL_ERROR("basisu_transcoder::start_transcoding: decode_tables failed\n");
				return false;
			}
		}
		else
		{
			// Nothing special to do for UASTC.
			if (m_lowlevel_etc1s_decoder.m_local_endpoints.size())
			{
				m_lowlevel_etc1s_decoder.clear();
			}
		}
		
		m_ready_to_transcode = true;

		return true;
	}